

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_clock.c
# Opt level: O1

int oonf_clock_update(void)

{
  oonf_log_source source;
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  uint64_t now;
  
  iVar1 = os_clock_linux_gettime64(&now);
  source = _oonf_clock_subsystem.logging;
  if (iVar1 == 0) {
    now_times = now - start_time;
    iVar1 = 0;
  }
  else {
    iVar1 = -1;
    if ((log_global_mask[_oonf_clock_subsystem.logging] & 4) != 0) {
      puVar2 = (uint *)__errno_location();
      pcVar3 = strerror(*puVar2);
      oonf_log(LOG_SEVERITY_WARN,source,"src/base/oonf_clock.c",0x70,(void *)0x0,0,
               "OS clock is not working: %s (%d)\n",pcVar3,(ulong)*puVar2);
    }
  }
  return iVar1;
}

Assistant:

int
oonf_clock_update(void) {
  uint64_t now;
  if (os_clock_gettime64(&now)) {
    OONF_WARN(LOG_CLOCK, "OS clock is not working: %s (%d)\n", strerror(errno), errno);
    return -1;
  }

  now_times = now - start_time;
  return 0;
}